

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O0

UniquePtr<SSL_SESSION> bssl::tls13_create_session_with_ticket(SSL *ssl,CBS *body)

{
  UniquePtr<SSL_SESSION> cbs;
  bool bVar1;
  int iVar2;
  pointer psVar3;
  size_t sVar4;
  uint8_t *d;
  uchar *md;
  __uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true> in_RDX;
  undefined1 in_R8B;
  undefined1 in_R9B;
  initializer_list<bssl::SSLExtension_*> extensions_00;
  Span<const_unsigned_char> SVar5;
  Span<const_unsigned_char> nonce;
  uint local_ec;
  size_t *psStack_e8;
  SSLFlags parsed;
  undefined1 *local_e0;
  uint8_t *local_d8;
  undefined8 local_d0;
  undefined1 local_c1 [4];
  byte local_bd;
  uint8_t alert;
  SSLExtension flags;
  SSLExtension early_data;
  undefined1 local_70 [8];
  CBS extensions;
  CBS ticket;
  CBS ticket_nonce;
  uint32_t server_timeout;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_28;
  UniquePtr<SSL_SESSION> session;
  CBS *body_local;
  SSL *ssl_local;
  
  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
       in_RDX.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(body[3].data + 0x200))
  ;
  SSL_SESSION_dup((bssl *)&local_28,psVar3,2);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_28);
  if (!bVar1) {
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0);
    goto LAB_001c7a48;
  }
  psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_28);
  ssl_session_rebase_time((SSL *)body,psVar3);
  iVar2 = CBS_get_u32((CBS *)session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                      (uint32_t *)&ticket_nonce.len);
  cbs = session;
  if (iVar2 != 0) {
    psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
    iVar2 = CBS_get_u32((CBS *)cbs._M_t.
                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                        &psVar3->ticket_age_add);
    if ((((iVar2 != 0) &&
         (iVar2 = CBS_get_u8_length_prefixed
                            ((CBS *)session._M_t.
                                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                             (CBS *)&ticket.len), iVar2 != 0)) &&
        (iVar2 = CBS_get_u16_length_prefixed
                           ((CBS *)session._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                            (CBS *)&extensions.len), iVar2 != 0)) &&
       (sVar4 = CBS_len((CBS *)&extensions.len), sVar4 != 0)) {
      psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
      SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&extensions.len);
      bVar1 = Array<unsigned_char>::CopyFrom(&psVar3->ticket,SVar5);
      if (((bVar1) &&
          (iVar2 = CBS_get_u16_length_prefixed
                             ((CBS *)session._M_t.
                                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                              (CBS *)local_70), iVar2 != 0)) &&
         (sVar4 = CBS_len((CBS *)session._M_t.
                                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl),
         sVar4 == 0)) {
        psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
        if ((uint)ticket_nonce.len < psVar3->timeout) {
          psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28);
          psVar3->timeout = (uint)ticket_nonce.len;
        }
        psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_28);
        SVar5 = cbs_st::operator_cast_to_Span((cbs_st *)&ticket.len);
        nonce.data_ = SVar5.size_;
        early_data.data.len = (size_t)SVar5.data_;
        iVar2 = SSL_is_dtls((SSL *)body);
        nonce.size_._0_1_ = iVar2 != 0;
        nonce.size_._1_7_ = 0;
        bVar1 = tls13_derive_session_psk
                          ((bssl *)psVar3,(SSL_SESSION *)early_data.data.len,nonce,(bool)in_R8B);
        if (bVar1) {
          SSLExtension::SSLExtension((SSLExtension *)&flags.data.len,0x2a,true);
          SSLExtension::SSLExtension((SSLExtension *)(local_c1 + 1),0x3e,true);
          local_c1[0] = 0x32;
          psStack_e8 = &flags.data.len;
          local_e0 = local_c1 + 1;
          local_d8 = (uint8_t *)&stack0xffffffffffffff18;
          local_d0 = 2;
          extensions_00._M_len = 1;
          extensions_00._M_array = (iterator)0x2;
          bVar1 = ssl_parse_extensions
                            ((bssl *)local_70,(CBS *)local_c1,local_d8,extensions_00,(bool)in_R9B);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            if ((flags.data.len._3_1_ & 1) != 0) {
              psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                 (&local_28);
              iVar2 = CBS_get_u32((CBS *)&early_data,&psVar3->ticket_max_early_data);
              if ((iVar2 == 0) || (sVar4 = CBS_len((CBS *)&early_data), sVar4 != 0)) {
                ssl_send_alert((SSL *)body,2,0x32);
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x4b4);
                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0)
                ;
                goto LAB_001c7a48;
              }
              iVar2 = SSL_is_quic((SSL *)body);
              if ((iVar2 != 0) &&
                 (psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                     (&local_28), psVar3->ticket_max_early_data != 0xffffffff)) {
                ssl_send_alert((SSL *)body,2,0x2f);
                ERR_put_error(0x10,0,0x89,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                              ,0x4bc);
                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0)
                ;
                goto LAB_001c7a48;
              }
            }
            if ((local_bd & 1) != 0) {
              bVar1 = ssl_parse_flags_extension_request((CBS *)&flags,&local_ec,local_c1);
              if (!bVar1) {
                ssl_send_alert((SSL *)body,2,(uint)local_c1[0]);
                std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0)
                ;
                goto LAB_001c7a48;
              }
              if ((local_ec & 0x100) != 0) {
                psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                                   (&local_28);
                psVar3->field_0x1b8 = psVar3->field_0x1b8 & 0x7f | 0x80;
              }
            }
            psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28)
            ;
            InplaceVector<unsigned_char,_32UL>::ResizeForOverwrite(&psVar3->session_id,0x20);
            d = CBS_data((CBS *)&extensions.len);
            sVar4 = CBS_len((CBS *)&extensions.len);
            psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28)
            ;
            md = InplaceVector<unsigned_char,_32UL>::data(&psVar3->session_id);
            SHA256(d,sVar4,md);
            psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28)
            ;
            psVar3->field_0x1b8 = psVar3->field_0x1b8 & 0xf7 | 8;
            psVar3 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&local_28)
            ;
            psVar3->field_0x1b8 = psVar3->field_0x1b8 & 0xfb;
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)ssl,&local_28);
          }
          else {
            ssl_send_alert((SSL *)body,2,(uint)local_c1[0]);
            std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0);
          }
        }
        else {
          std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0);
        }
        goto LAB_001c7a48;
      }
    }
  }
  ssl_send_alert((SSL *)body,2,0x32);
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_client.cc"
                ,0x498);
  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)ssl,(nullptr_t)0x0);
LAB_001c7a48:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)ssl;
}

Assistant:

UniquePtr<SSL_SESSION> tls13_create_session_with_ticket(SSL *ssl, CBS *body) {
  UniquePtr<SSL_SESSION> session = SSL_SESSION_dup(
      ssl->s3->established_session.get(), SSL_SESSION_INCLUDE_NONAUTH);
  if (!session) {
    return nullptr;
  }

  ssl_session_rebase_time(ssl, session.get());

  uint32_t server_timeout;
  CBS ticket_nonce, ticket, extensions;
  if (!CBS_get_u32(body, &server_timeout) ||
      !CBS_get_u32(body, &session->ticket_age_add) ||
      !CBS_get_u8_length_prefixed(body, &ticket_nonce) ||
      !CBS_get_u16_length_prefixed(body, &ticket) ||
      CBS_len(&ticket) == 0 ||  //
      !session->ticket.CopyFrom(ticket) ||
      !CBS_get_u16_length_prefixed(body, &extensions) ||  //
      CBS_len(body) != 0) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  // Cap the renewable lifetime by the server advertised value. This avoids
  // wasting bandwidth on 0-RTT when we know the server will reject it.
  if (session->timeout > server_timeout) {
    session->timeout = server_timeout;
  }

  if (!tls13_derive_session_psk(session.get(), ticket_nonce,
                                SSL_is_dtls(ssl))) {
    return nullptr;
  }

  SSLExtension early_data(TLSEXT_TYPE_early_data);
  SSLExtension flags(TLSEXT_TYPE_tls_flags);
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_parse_extensions(&extensions, &alert, {&early_data, &flags},
                            /*ignore_unknown=*/true)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return nullptr;
  }

  if (early_data.present) {
    if (!CBS_get_u32(&early_data.data, &session->ticket_max_early_data) ||
        CBS_len(&early_data.data) != 0) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }

    // QUIC does not use the max_early_data_size parameter and always sets it to
    // a fixed value. See RFC 9001, section 4.6.1.
    if (SSL_is_quic(ssl) && session->ticket_max_early_data != 0xffffffff) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return nullptr;
    }
  }

  if (flags.present) {
    SSLFlags parsed;
    if (!ssl_parse_flags_extension_request(&flags.data, &parsed, &alert)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return nullptr;
    }
    if (parsed & kSSLFlagResumptionAcrossNames) {
      session->is_resumable_across_names = true;
    }
  }

  // Historically, OpenSSL filled in fake session IDs for ticket-based sessions.
  // Envoy's tests depend on this, although perhaps they shouldn't.
  session->session_id.ResizeForOverwrite(SHA256_DIGEST_LENGTH);
  SHA256(CBS_data(&ticket), CBS_len(&ticket), session->session_id.data());

  session->ticket_age_add_valid = true;
  session->not_resumable = false;

  return session;
}